

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeGetNumStepSensSolveFails(void *cvode_mem,long *nSncfails)

{
  long *in_RSI;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x93e,"CVodeGetNumStepSensSolveFails",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_sensi == 0) {
    cvProcessError(in_RDI,-0x28,0x946,"CVodeGetNumStepSensSolveFails",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"Forward sensitivity analysis not activated.");
    local_4 = -0x28;
  }
  else {
    *in_RSI = in_RDI->cv_ncfnS;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetNumStepSensSolveFails(void* cvode_mem, long int* nSncfails)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  *nSncfails = cv_mem->cv_ncfnS;

  return (CV_SUCCESS);
}